

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_key_derivation_set_capacity(psa_key_derivation_operation_t *operation,size_t capacity)

{
  size_t capacity_local;
  psa_key_derivation_operation_t *operation_local;
  
  if (operation->alg == 0) {
    operation_local._4_4_ = -0x89;
  }
  else if (operation->capacity < capacity) {
    operation_local._4_4_ = -0x87;
  }
  else {
    operation->capacity = capacity;
    operation_local._4_4_ = 0;
  }
  return operation_local._4_4_;
}

Assistant:

psa_status_t psa_key_derivation_set_capacity( psa_key_derivation_operation_t *operation,
                                         size_t capacity )
{
    if( operation->alg == 0 )
        return( PSA_ERROR_BAD_STATE );
    if( capacity > operation->capacity )
        return( PSA_ERROR_INVALID_ARGUMENT );
    operation->capacity = capacity;
    return( PSA_SUCCESS );
}